

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall
SGParser::Parse<SGParser::Generator::RegExprDFAParseElement>::Parse
          (Parse<SGParser::Generator::RegExprDFAParseElement> *this,ParseTable *ptable,
          TokenStream<SGParser::Generator::RegExprParseToken> *ptokenStream,size_t stackSize)

{
  size_t stackSize_local;
  TokenStream<SGParser::Generator::RegExprParseToken> *ptokenStream_local;
  ParseTable *ptable_local;
  Parse<SGParser::Generator::RegExprDFAParseElement> *this_local;
  
  this->pParseTable = (ParseTable *)0x0;
  this->pTokenizer = (TokenStream<SGParser::Generator::RegExprParseToken> *)0x0;
  BacktrackingTokenStream<SGParser::Generator::RegExprParseToken>::BacktrackingTokenStream
            (&this->Stream);
  this->StackPosition = 0;
  this->StackSize = 0;
  this->pStack = (RegExprDFAParseElement *)0x0;
  this->TopState = 0xffffffff;
  this->NextTokenFlag = false;
  this->PrevTokenIndex = 0xffffffffffffffff;
  Generator::RegExprParseToken::RegExprParseToken(&this->Token);
  this->ReduceLeft = 0;
  this->pValidTokenStackPositions = (size_t *)0x0;
  this->ErrorMarker = 0xffffffffffffffff;
  this->LastErrorState = 0xffffffff;
  std::__cxx11::string::string((string *)&this->ErrorStackStr);
  Create(this,ptable,ptokenStream,stackSize);
  return;
}

Assistant:

Parse(const ParseTable* ptable, TokenStream<TokenType>* ptokenStream,
          size_t stackSize = DefaultStackSize) {
        Create(ptable, ptokenStream, stackSize);
    }